

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PSound::ReadValue(PSound *this,FSerializer *ar,char *key,void *addr)

{
  int iVar1;
  char *in_RAX;
  char *cptr;
  char *local_18;
  
  local_18 = in_RAX;
  FSerializer::StringPtr(ar,key,&local_18);
  if (local_18 != (char *)0x0) {
    iVar1 = S_FindSound(local_18);
    *(int *)addr = iVar1;
  }
  return local_18 != (char *)0x0;
}

Assistant:

bool PSound::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	const char *cptr;
	ar.StringPtr(key, cptr);
	if (cptr == nullptr)
	{
		return false;
	}
	else
	{
		*(FSoundID *)addr = FSoundID(cptr);
		return true;
	}
}